

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observernotifier.cpp
# Opt level: O0

void __thiscall
camp::detail::ObserverNotifier::notifyClassAdded(ObserverNotifier *this,Class *theClass)

{
  bool bVar1;
  reference ppOVar2;
  _Self local_28;
  _Self local_20;
  iterator it;
  Class *theClass_local;
  ObserverNotifier *this_local;
  
  it._M_node = (_Base_ptr)theClass;
  local_20._M_node =
       (_Base_ptr)
       std::set<camp::Observer_*,_std::less<camp::Observer_*>,_std::allocator<camp::Observer_*>_>::
       begin(&this->m_observers);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<camp::Observer_*,_std::less<camp::Observer_*>,_std::allocator<camp::Observer_*>_>
         ::end(&this->m_observers);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppOVar2 = std::_Rb_tree_const_iterator<camp::Observer_*>::operator*(&local_20);
    (*(*ppOVar2)->_vptr_Observer[2])(*ppOVar2,it._M_node);
    std::_Rb_tree_const_iterator<camp::Observer_*>::operator++(&local_20);
  }
  return;
}

Assistant:

void ObserverNotifier::notifyClassAdded(const Class& theClass)
{
    for (ObserverSet::iterator it = m_observers.begin(); it != m_observers.end(); ++it)
    {
        (*it)->classAdded(theClass);
    }
}